

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O2

deBool deSocketAddressToBsdAddress
                 (deSocketAddress *address,size_t bsdAddrBufSize,sockaddr *bsdAddr,
                 NativeSocklen *bsdAddrLen)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  addrinfo *__ai;
  deBool dVar6;
  int iVar7;
  deBool dVar8;
  sockaddr_in *addr4;
  deBool dVar9;
  ulong uVar10;
  addrinfo *result;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  *(undefined1 (*) [16])(bsdAddrBufSize + 0xc) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])bsdAddrBufSize = (undefined1  [16])0x0;
  if (address->host == (char *)0x0) {
    if (address->family == DE_SOCKETFAMILY_INET6) {
      uVar3 = (ushort)address->port;
      *(ushort *)(bsdAddrBufSize + 2) = uVar3 << 8 | uVar3 >> 8;
      *(undefined2 *)bsdAddrBufSize = 10;
      bsdAddr->sa_family = 0x1c;
      bsdAddr->sa_data[0] = '\0';
      bsdAddr->sa_data[1] = '\0';
    }
    else {
      if (address->family != DE_SOCKETFAMILY_INET4) {
        return 0;
      }
      uVar3 = (ushort)address->port;
      *(ushort *)(bsdAddrBufSize + 2) = uVar3 << 8 | uVar3 >> 8;
      *(undefined2 *)bsdAddrBufSize = 2;
      bsdAddr->sa_family = 0x10;
      bsdAddr->sa_data[0] = '\0';
      bsdAddr->sa_data[1] = '\0';
    }
LAB_0011f06a:
    dVar9 = 1;
  }
  else {
    result = (addrinfo *)0x0;
    local_38 = (undefined1  [16])0x0;
    local_48 = (undefined1  [16])0x0;
    uVar1 = address->family;
    uVar2 = address->type;
    uVar10 = CONCAT44(-(uint)(uVar2 == 0),-(uint)(uVar1 == 0));
    dVar9 = 0;
    dVar8 = 0x11;
    if (address->protocol != DE_SOCKETPROTOCOL_UDP) {
      dVar8 = dVar9;
    }
    dVar6 = 6;
    if (address->protocol != DE_SOCKETPROTOCOL_TCP) {
      dVar6 = dVar8;
    }
    local_58._8_4_ = dVar6;
    local_58._0_8_ =
         ~uVar10 & CONCAT44(-(uint)(uVar2 == 1),-(uint)(uVar1 == 1)) & (ulong)DAT_00122a80 |
         uVar10 & (ulong)DAT_00122a70;
    local_58._12_4_ = 0;
    local_58 = local_58 << 0x20;
    iVar7 = getaddrinfo(address->host,(char *)0x0,(addrinfo *)local_58,(addrinfo **)&result);
    __ai = result;
    if (iVar7 == 0 && result != (addrinfo *)0x0) {
      uVar4 = result->ai_addrlen;
      if (uVar4 < 0x1d) {
        bsdAddr->sa_family = (short)uVar4;
        bsdAddr->sa_data[0] = (char)(uVar4 >> 0x10);
        bsdAddr->sa_data[1] = (char)(uVar4 >> 0x18);
        memcpy((void *)bsdAddrBufSize,result->ai_addr,(ulong)result->ai_addrlen);
        freeaddrinfo((addrinfo *)__ai);
        if (*(short *)bsdAddrBufSize == 10) {
          uVar4._0_2_ = bsdAddr->sa_family;
          uVar4._2_1_ = bsdAddr->sa_data[0];
          uVar4._3_1_ = bsdAddr->sa_data[1];
          if (uVar4 < 0x1c) {
            return 0;
          }
        }
        else {
          if (*(short *)bsdAddrBufSize != 2) {
            return 0;
          }
          uVar5._0_2_ = bsdAddr->sa_family;
          uVar5._2_1_ = bsdAddr->sa_data[0];
          uVar5._3_1_ = bsdAddr->sa_data[1];
          if (uVar5 < 0x10) {
            return 0;
          }
        }
        uVar3 = (ushort)address->port;
        *(ushort *)(bsdAddrBufSize + 2) = uVar3 << 8 | uVar3 >> 8;
        goto LAB_0011f06a;
      }
    }
    else if (result == (addrinfo *)0x0) {
      return 0;
    }
    freeaddrinfo((addrinfo *)result);
  }
  return dVar9;
}

Assistant:

static deBool deSocketAddressToBsdAddress (const deSocketAddress* address, size_t bsdAddrBufSize, struct sockaddr* bsdAddr, NativeSocklen* bsdAddrLen)
{
	deMemset(bsdAddr, 0, bsdAddrBufSize);

	/* Resolve host. */
	if (address->host != DE_NULL)
	{
		struct addrinfo*	result	= DE_NULL;
		struct addrinfo		hints;

		deMemset(&hints, 0, sizeof(hints));
		hints.ai_family		= deSocketFamilyToBsdFamily(address->family);
		hints.ai_socktype	= deSocketTypeToBsdType(address->type);
		hints.ai_protocol	= deSocketProtocolToBsdProtocol(address->protocol);

		if (getaddrinfo(address->host, DE_NULL, &hints, &result) != 0 || !result)
		{
			if (result)
				freeaddrinfo(result);
			return DE_FALSE;
		}

		/* \note Always uses first address. */

		if (bsdAddrBufSize < (size_t)result->ai_addrlen)
		{
			DE_FATAL("Too small bsdAddr buffer");
			freeaddrinfo(result);
			return DE_FALSE;
		}

		*bsdAddrLen	= (NativeSocklen)result->ai_addrlen;

		deMemcpy(bsdAddr, result->ai_addr, (size_t)result->ai_addrlen);
		freeaddrinfo(result);

		/* Add port. */
		if (bsdAddr->sa_family == AF_INET)
		{
			if (*bsdAddrLen < (NativeSocklen)sizeof(struct sockaddr_in))
				return DE_FALSE;
			((struct sockaddr_in*)bsdAddr)->sin_port = deHostToNetworkOrder16((deUint16)address->port);
		}
		else if (bsdAddr->sa_family == AF_INET6)
		{
			if (*bsdAddrLen < (NativeSocklen)sizeof(struct sockaddr_in6))
				return DE_FALSE;
			((struct sockaddr_in6*)bsdAddr)->sin6_port = deHostToNetworkOrder16((deUint16)address->port);
		}
		else
			return DE_FALSE;

		return DE_TRUE;
	}
	else if (address->family == DE_SOCKETFAMILY_INET4)
	{
		struct sockaddr_in* addr4 = (struct sockaddr_in*)bsdAddr;

		if (bsdAddrBufSize < sizeof(struct sockaddr_in))
		{
			DE_FATAL("Too small bsdAddr buffer");
			return DE_FALSE;
		}

		addr4->sin_port			= deHostToNetworkOrder16((deUint16)address->port);
		addr4->sin_family		= AF_INET;
		addr4->sin_addr.s_addr	= INADDR_ANY;

		*bsdAddrLen	= (NativeSocklen)sizeof(struct sockaddr_in);

		return DE_TRUE;
	}
	else if (address->family == DE_SOCKETFAMILY_INET6)
	{
		struct sockaddr_in6* addr6 = (struct sockaddr_in6*)bsdAddr;

		if (bsdAddrBufSize < sizeof(struct sockaddr_in6))
		{
			DE_FATAL("Too small bsdAddr buffer");
			return DE_FALSE;
		}

		addr6->sin6_port	= deHostToNetworkOrder16((deUint16)address->port);
		addr6->sin6_family	= AF_INET6;

		*bsdAddrLen	= (NativeSocklen)sizeof(struct sockaddr_in6);

		return DE_TRUE;
	}
	else
		return DE_FALSE;
}